

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

bool AM_clipMline(mline_t *ml,fline_t *fl)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  double dVar22;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  
  dVar6 = m_x;
  dVar5 = scale_mtof;
  dVar1 = (ml->a).y;
  uVar9 = 8;
  uVar11 = 8;
  if ((dVar1 <= m_y2) && (uVar11 = 0, dVar1 < m_y)) {
    uVar11 = 4;
  }
  dVar2 = (ml->b).y;
  if ((dVar2 <= m_y2) && (uVar9 = 0, dVar2 < m_y)) {
    uVar9 = 4;
  }
  if ((uVar9 & uVar11) == 0) {
    dVar3 = (ml->a).x;
    if (m_x <= dVar3) {
      if (m_x2 < dVar3) {
        uVar11 = uVar11 | 2;
      }
    }
    else {
      uVar11 = uVar11 | 1;
    }
    dVar4 = (ml->b).x;
    if (m_x <= dVar4) {
      if (m_x2 < dVar4) {
        uVar9 = uVar9 | 2;
      }
    }
    else {
      uVar9 = uVar9 | 1;
    }
    if ((uVar9 & uVar11) == 0) {
      uVar12 = (uint)((dVar3 - m_x) * scale_mtof);
      (fl->a).x = uVar12;
      iVar8 = f_h;
      dVar3 = m_y;
      dVar22 = (double)f_h;
      iVar14 = (int)(dVar22 - (dVar1 - m_y) * dVar5);
      bVar21 = f_h <= iVar14;
      (fl->a).y = iVar14;
      uVar9 = (uint)((dVar4 - dVar6) * dVar5);
      iVar17 = (int)(dVar22 - (dVar2 - dVar3) * dVar5);
      (fl->b).x = uVar9;
      (fl->b).y = iVar17;
      iVar7 = f_w;
      uVar11 = (uint)bVar21 << 2;
      if (iVar14 < 0) {
        uVar11 = 8;
      }
      if ((int)uVar12 < 0) {
        uVar11 = uVar11 | 1;
      }
      else if (f_w <= (int)uVar12) {
        uVar11 = uVar11 | 2;
      }
      uVar20 = (uint)(iVar8 <= iVar17) << 2;
      if (iVar17 < 0) {
        uVar20 = 8;
      }
      if ((int)uVar9 < 0) {
        uVar20 = uVar20 | 1;
      }
      else if (f_w <= (int)uVar9) {
        uVar20 = uVar20 | 2;
      }
      uVar10 = 0;
      if ((uVar20 & uVar11) != 0) {
        return false;
      }
      uVar13 = f_w - 1;
      iVar15 = 0;
      iVar18 = iVar14;
      local_74 = iVar17;
      local_70 = uVar9;
      local_6c = uVar12;
      local_68 = iVar17;
      local_64 = iVar14;
      local_60 = uVar9;
      local_5c = uVar12;
      local_58 = iVar17;
      local_54 = iVar14;
      local_50 = uVar12;
      local_4c = uVar9;
      do {
        bVar21 = uVar20 == 0 && uVar11 == 0;
        if (bVar21) {
          return bVar21;
        }
        uVar16 = uVar11;
        if (uVar11 == 0) {
          uVar16 = uVar20;
        }
        if ((uVar16 & 8) == 0) {
          if ((uVar16 & 4) == 0) {
            if ((uVar16 & 2) == 0) {
              if ((uVar16 & 1) != 0) {
                local_5c = local_50;
                local_60 = local_4c;
                local_64 = local_54;
                local_68 = local_58;
                local_6c = local_50;
                local_70 = local_4c;
                local_74 = local_58;
                uVar9 = local_4c;
                uVar10 = 0;
                uVar12 = local_50;
                iVar14 = local_54;
                iVar17 = local_58;
                iVar18 = local_54;
                iVar15 = (int)(((long)(int)-local_50 * (long)(local_58 - local_54)) /
                              (long)(int)(local_4c - local_50)) + local_54;
              }
            }
            else {
              local_6c = local_5c;
              local_70 = local_60;
              local_74 = local_68;
              uVar9 = local_60;
              uVar10 = uVar13;
              uVar12 = local_5c;
              iVar14 = local_64;
              iVar17 = local_68;
              iVar18 = local_64;
              iVar15 = (int)(((long)(int)(~local_5c + iVar7) * (long)(local_68 - local_64)) /
                            (long)(int)(local_60 - local_5c)) + local_64;
            }
          }
          else {
            uVar10 = (int)(((long)(iVar18 - iVar8) * (long)(int)(local_70 - local_6c)) /
                          (long)(iVar18 - local_74)) + local_6c;
            uVar9 = local_70;
            uVar12 = local_6c;
            iVar14 = iVar18;
            iVar17 = local_74;
            iVar15 = iVar8 + -1;
          }
        }
        else {
          uVar10 = (int)(((long)iVar14 * (long)(int)(uVar9 - uVar12)) / (long)(iVar14 - iVar17)) +
                   uVar12;
          iVar15 = 0;
        }
        uVar19 = 8;
        if (-1 < iVar15) {
          uVar19 = (uint)(iVar8 <= iVar15) << 2;
        }
        if (uVar16 == uVar11) {
          (fl->a).x = uVar10;
          (fl->a).y = iVar15;
          uVar12 = uVar10;
          iVar14 = iVar15;
          iVar18 = iVar15;
          local_6c = uVar10;
          local_64 = iVar15;
          local_5c = uVar10;
          local_54 = iVar15;
          local_50 = uVar10;
          if ((int)uVar10 < 0) {
            uVar11 = uVar19 | 1;
          }
          else {
            uVar11 = uVar19 | 2;
            if ((int)uVar10 < iVar7) {
              uVar11 = uVar19;
            }
          }
        }
        else {
          (fl->b).x = uVar10;
          (fl->b).y = iVar15;
          uVar9 = uVar10;
          iVar17 = iVar15;
          local_74 = iVar15;
          local_70 = uVar10;
          local_68 = iVar15;
          local_60 = uVar10;
          local_58 = iVar15;
          local_4c = uVar10;
          if ((int)uVar10 < 0) {
            uVar20 = uVar19 | 1;
          }
          else {
            uVar20 = uVar19 | 2;
            if ((int)uVar10 < iVar7) {
              uVar20 = uVar19;
            }
          }
        }
      } while ((uVar20 & uVar11) == 0);
      return bVar21;
    }
  }
  return false;
}

Assistant:

bool AM_clipMline (mline_t *ml, fline_t *fl)
{
	enum {
		LEFT	=1,
		RIGHT	=2,
		BOTTOM	=4,
		TOP		=8
	};

	int outcode1 = 0;
	int outcode2 = 0;
	int outside;

	fpoint_t tmp = { 0, 0 };
	int dx;
	int dy;

#define DOOUTCODE(oc, mx, my) \
	(oc) = 0; \
	if ((my) < 0) (oc) |= TOP; \
	else if ((my) >= f_h) (oc) |= BOTTOM; \
	if ((mx) < 0) (oc) |= LEFT; \
	else if ((mx) >= f_w) (oc) |= RIGHT;

	// do trivial rejects and outcodes
	if (ml->a.y > m_y2)
		outcode1 = TOP;
	else if (ml->a.y < m_y)
		outcode1 = BOTTOM;

	if (ml->b.y > m_y2)
		outcode2 = TOP;
	else if (ml->b.y < m_y)
		outcode2 = BOTTOM;

	if (outcode1 & outcode2)
		return false; // trivially outside

	if (ml->a.x < m_x)
		outcode1 |= LEFT;
	else if (ml->a.x > m_x2)
		outcode1 |= RIGHT;

	if (ml->b.x < m_x)
		outcode2 |= LEFT;
	else if (ml->b.x > m_x2)
		outcode2 |= RIGHT;

	if (outcode1 & outcode2)
		return false; // trivially outside

	// transform to frame-buffer coordinates.
	fl->a.x = CXMTOF(ml->a.x);
	fl->a.y = CYMTOF(ml->a.y);
	fl->b.x = CXMTOF(ml->b.x);
	fl->b.y = CYMTOF(ml->b.y);

	DOOUTCODE(outcode1, fl->a.x, fl->a.y);
	DOOUTCODE(outcode2, fl->b.x, fl->b.y);

	if (outcode1 & outcode2)
		return false;

	while (outcode1 | outcode2) {
		// may be partially inside box
		// find an outside point
		if (outcode1)
			outside = outcode1;
		else
			outside = outcode2;
	
		// clip to each side
		if (outside & TOP)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y, dy);
			tmp.y = 0;
		}
		else if (outside & BOTTOM)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y - f_h, dy);
			tmp.y = f_h-1;
		}
		else if (outside & RIGHT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, f_w-1 - fl->a.x, dx);
			tmp.x = f_w-1;
		}
		else if (outside & LEFT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, -fl->a.x, dx);
			tmp.x = 0;
		}

		if (outside == outcode1)
		{
			fl->a = tmp;
			DOOUTCODE(outcode1, fl->a.x, fl->a.y);
		}
		else
		{
			fl->b = tmp;
			DOOUTCODE(outcode2, fl->b.x, fl->b.y);
		}
	
		if (outcode1 & outcode2)
			return false; // trivially outside
	}

	return true;
}